

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O2

void __thiscall
Eigen::internal::
BlockImpl_dense<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_2,_-1,_false>,_1,_-1,_false,_true>
::BlockImpl_dense(BlockImpl_dense<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_1,__1,_false,_true>
                  *this,Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>
                        *xpr,Index i)

{
  MapBase<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_2,_-1,_false>,_1,_-1,_false>,_0>
  ::MapBase(&this->
             super_MapBase<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_1,__1,_false>,_0>
            ,(xpr->
             super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false,_Eigen::Dense>
             ).
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_0>
             .m_data + i,1,
            (xpr->
            super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false,_Eigen::Dense>
            ).
            super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false,_true>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_1>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_0>
            .m_cols.m_value);
  BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_2,_-1,_false,_true>
  ::BlockImpl_dense((BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false,_true>
                     *)&this->m_xpr,
                    (BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false,_true>
                     *)xpr);
  this->m_outerStride = 1;
  return;
}

Assistant:

inline BlockImpl_dense(XprType& xpr, Index i)
      : Base(internal::const_cast_ptr(&xpr.coeffRef(
              (BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) ? i : 0,
              (BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) ? i : 0)),
             BlockRows==1 ? 1 : xpr.rows(),
             BlockCols==1 ? 1 : xpr.cols()),
        m_xpr(xpr)
    {
      init();
    }